

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O0

void __thiscall
GlobOptBlockData::MarkTempLastUse(GlobOptBlockData *this,Instr *instr,RegOpnd *regOpnd)

{
  bool bVar1;
  BOOLEAN BVar2;
  uint sourceContextId;
  uint functionId;
  RegOpnd *regOpnd_local;
  Instr *instr_local;
  GlobOptBlockData *this_local;
  
  bVar1 = OpCodeAttr::NonTempNumberSources(instr->m_opcode);
  if (bVar1) {
    BVSparse<Memory::JitArenaAllocator>::Clear(this->isTempSrc,(regOpnd->m_sym->super_Sym).m_id);
  }
  else {
    BVar2 = BVSparse<Memory::JitArenaAllocator>::Test
                      (this->isTempSrc,(regOpnd->m_sym->super_Sym).m_id);
    if (BVar2 != '\0') {
      sourceContextId = Func::GetSourceContextId(this->globOpt->func);
      functionId = Func::GetLocalFunctionId(this->globOpt->func);
      bVar1 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_01eafdf0,BackwardPhase,sourceContextId,functionId);
      if ((!bVar1) && (bVar1 = GlobOpt::IsLoopPrePass(this->globOpt), !bVar1)) {
        regOpnd->field_0x18 = regOpnd->field_0x18 & 0xfe | 1;
      }
    }
  }
  return;
}

Assistant:

void
GlobOptBlockData::MarkTempLastUse(IR::Instr *instr, IR::RegOpnd *regOpnd)
{
    if (OpCodeAttr::NonTempNumberSources(instr->m_opcode))
    {
        // Turn off bit if opcode could cause the src to be aliased.
        this->isTempSrc->Clear(regOpnd->m_sym->m_id);
    }
    else if (this->isTempSrc->Test(regOpnd->m_sym->m_id))
    {
        // We just mark things that are temp in the globopt phase.
        // The backwards phase will turn this off if it is not the last use.
        // The isTempSrc is freed at the end of each block, which is why the backwards phase can't
        // just use it.
        if (!PHASE_OFF(Js::BackwardPhase, this->globOpt->func) && !this->globOpt->IsLoopPrePass())
        {
            regOpnd->m_isTempLastUse = true;
        }
    }
}